

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondR.cpp
# Opt level: O1

void __thiscall
OpenMD::HBondR::HBondR
          (HBondR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          double rCut,RealType len,double thetaCut,int nrbins)

{
  pointer pcVar1;
  pointer __s;
  pointer pdVar2;
  pointer __s_00;
  pointer piVar3;
  SelectionEvaluator *this_00;
  long *plVar4;
  pointer pOVar5;
  long lVar6;
  undefined1 local_100 [24];
  long lStack_e8;
  SelectionEvaluator *local_e0;
  SelectionEvaluator *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  SelectionEvaluator *local_a0;
  SelectionManager *local_98;
  string *local_90;
  SelectionManager *local_88;
  string *local_80;
  SelectionManager *local_78;
  string *local_70;
  string *local_68;
  RealType local_60;
  RealType local_58;
  string local_50;
  
  local_68 = filename;
  local_60 = rCut;
  local_58 = thetaCut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__HBondR_0033a780;
  local_70 = &this->selectionScript1_;
  local_c0 = &(this->selectionScript1_).field_2;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)local_c0;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + sele1->_M_string_length);
  local_78 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_78,info);
  local_d8 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(local_d8,info);
  local_80 = &this->selectionScript2_;
  local_c8 = &(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)local_c8;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + sele2->_M_string_length);
  local_88 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_88,info);
  local_a0 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_a0,info);
  local_90 = &this->selectionScript3_;
  local_d0 = &(this->selectionScript3_).field_2;
  (this->selectionScript3_)._M_dataplus._M_p = (pointer)local_d0;
  pcVar1 = (sele3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + sele3->_M_string_length);
  local_98 = &this->seleMan3_;
  SelectionManager::SelectionManager(local_98,info);
  local_e0 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator(local_e0,info);
  this_00 = local_a0;
  this->len_ = len;
  this->nBins_ = nrbins;
  local_b8 = &this->sliceCount_;
  local_a8 = &this->nDonor_;
  local_b0 = &this->nAcceptor_;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->ff_ = ((this->super_StaticAnalyser).info_)->forceField_;
  SelectionEvaluator::loadScriptString(local_d8,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_100,local_d8);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_100._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_100);
  }
  SelectionEvaluator::loadScriptString(this_00,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_100,this_00);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_100._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_100);
  }
  SelectionEvaluator::loadScriptString(local_e0,sele3);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_100,local_e0);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan3_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_100._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_100);
  }
  this->rCut_ = local_60;
  this->thetaCut_ = local_58;
  this->deltaR_ = this->len_ / (double)this->nBins_;
  this->nBins_ = nrbins;
  std::vector<int,_std::allocator<int>_>::resize(&this->nHBonds_,(long)nrbins);
  std::vector<int,_std::allocator<int>_>::resize(local_a8,(long)this->nBins_);
  std::vector<int,_std::allocator<int>_>::resize(local_b0,(long)this->nBins_);
  std::vector<double,_std::allocator<double>_>::resize(&this->sliceQ_,(long)this->nBins_);
  std::vector<int,_std::allocator<int>_>::resize(local_b8,(long)this->nBins_);
  __s = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar2 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar2) {
    memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  __s_00 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s_00 != piVar3) {
    memset(__s_00,0,((long)piVar3 + (-4 - (long)__s_00) & 0xfffffffffffffffcU) + 4);
  }
  getPrefix(&local_50,local_68);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar5 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pOVar5) {
    local_100._16_8_ =
         (pOVar5->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_e8 = plVar4[3];
    local_100._0_8_ = (pointer)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ =
         (pOVar5->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_100._0_8_ = (pointer)*plVar4;
  }
  local_100._8_8_ = plVar4[1];
  *plVar4 = (long)pOVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_100._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

HBondR::HBondR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, double rCut, RealType len,
                 double thetaCut, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript1_(sele1), seleMan1_(info), evaluator1_(info),
      selectionScript2_(sele2), seleMan2_(info), evaluator2_(info),
      selectionScript3_(sele3), seleMan3_(info), evaluator3_(info), len_(len),
      nBins_(nrbins) {
    ff_ = info_->getForceField();

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    // Set up cutoff values:

    rCut_     = rCut;
    thetaCut_ = thetaCut;
    deltaR_   = len_ / nBins_;
    nBins_    = nrbins;
    // fixed number of bins

    nHBonds_.resize(nBins_);
    nDonor_.resize(nBins_);
    nAcceptor_.resize(nBins_);
    sliceQ_.resize(nBins_);
    sliceCount_.resize(nBins_);
    std::fill(sliceQ_.begin(), sliceQ_.end(), 0.0);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".hbondr");
  }